

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O0

int anon_unknown.dwarf_1381c::skip_input_output_arg(char *arg,char *input_fname)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  int local_4;
  
  iVar1 = strcmp(in_RDI,in_RSI);
  if (iVar1 == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = strcmp(in_RDI,"-o");
    if ((iVar1 != 0) && (iVar1 = strcmp(in_RDI,"--output"), iVar1 != 0)) {
      iVar1 = strncmp(in_RDI,"--output=",9);
      if (iVar1 == 0) {
        return 1;
      }
      return 0;
    }
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int skip_input_output_arg(const char *arg, const char *input_fname) {
  if (strcmp(arg, input_fname) == 0) {
    return 1;
  }
  if (strcmp(arg, "-o") == 0 || strcmp(arg, "--output") == 0) {
    return 2;
  }
  if (strncmp(arg, "--output=", strlen("--output=")) == 0) {
    return 1;
  }
  return 0;
}